

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O0

bool __thiscall RasterizerAGG::addPoly(RasterizerAGG *this,Point *poly,size_t count)

{
  ulong local_30;
  size_t i;
  size_t count_local;
  Point *poly_local;
  RasterizerAGG *this_local;
  
  if (count != 0) {
    agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::move_to_d
              (&this->_rasterizer,poly->x,poly->y);
    for (local_30 = 1; local_30 < count; local_30 = local_30 + 1) {
      agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::line_to_d
                (&this->_rasterizer,poly[local_30].x,poly[local_30].y);
    }
    agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::close_polygon
              (&this->_rasterizer);
  }
  return true;
}

Assistant:

bool RasterizerAGG::addPoly(const Point* poly, size_t count) noexcept {
  if (!count)
    return true;

  _rasterizer.move_to_d(poly[0].x, poly[0].y);
  for (size_t i = 1; i < count; i++)
    _rasterizer.line_to_d(poly[i].x, poly[i].y);
  _rasterizer.close_polygon();

  return true;
}